

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O0

void Extra_TestAndPerm(DdManager *ddF,DdNode *bF,DdNode *bG)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  DdManager *table;
  DdNode *n;
  abctime aVar6;
  DdNode *n_00;
  abctime aVar7;
  DdNode *n_01;
  abctime clk;
  DdNode *bRes2;
  DdNode *bRes1;
  DdNode *bG2;
  DdManager *ddG;
  DdNode *bG_local;
  DdNode *bF_local;
  DdManager *ddF_local;
  
  Cudd_AutodynDisable(ddF);
  table = Cudd_Init(ddF->size,0,0x100,0x40000,0);
  Cudd_ShuffleHeap(table,ddF->invperm);
  n = Extra_TransferLevelByLevel(ddF,table,bG);
  Cudd_Ref(n);
  Cudd_ReduceHeap(table,CUDD_REORDER_SYMM_SIFT,1);
  aVar6 = Abc_Clock();
  n_00 = Cudd_bddAnd(ddF,bF,bG);
  Cudd_Ref(n_00);
  aVar7 = Abc_Clock();
  Abc_PrintTime(1,"Runtime of Cudd_bddAnd  ",aVar7 - aVar6);
  Counter = 0;
  aVar6 = Abc_Clock();
  n_01 = Extra_bddAndPermute(ddF,bF,table,n,(int *)0x0);
  Cudd_Ref(n_01);
  aVar7 = Abc_Clock();
  Abc_PrintTime(1,"Runtime of new procedure",aVar7 - aVar6);
  printf("Recursive calls = %d\n",(ulong)(uint)Counter);
  uVar1 = Cudd_DagSize(bF);
  uVar2 = Cudd_DagSize(bG);
  uVar3 = Cudd_DagSize(n_01);
  iVar4 = Cudd_DagSize(bF);
  iVar5 = Cudd_DagSize(bG);
  printf("|F| =%6d  |G| =%6d  |H| =%6d  |F|*|G| =%9d  ",(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,
         (ulong)(uint)(iVar4 * iVar5));
  if (n_00 == n_01) {
    printf("Result verified.\n\n");
  }
  else {
    printf("Result is incorrect.\n\n");
  }
  Cudd_RecursiveDeref(ddF,n_00);
  Cudd_RecursiveDeref(ddF,n_01);
  Cudd_RecursiveDeref(table,n);
  Extra_StopManager(table);
  Cudd_AutodynEnable(ddF,CUDD_REORDER_SYMM_SIFT);
  return;
}

Assistant:

void Extra_TestAndPerm( DdManager * ddF, DdNode * bF, DdNode * bG )
{
    DdManager * ddG;
    DdNode * bG2, * bRes1, * bRes2;
    abctime clk;
    // disable variable ordering in ddF
    Cudd_AutodynDisable( ddF );

    // create new BDD manager
    ddG = Cudd_Init( ddF->size, 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    // transfer BDD into it
    Cudd_ShuffleHeap( ddG, ddF->invperm );
    bG2 = Extra_TransferLevelByLevel( ddF, ddG, bG );   Cudd_Ref( bG2 );
    // reorder the new manager
    Cudd_ReduceHeap( ddG, CUDD_REORDER_SYMM_SIFT, 1 );

    // compute the result
clk = Abc_Clock();
    bRes1 = Cudd_bddAnd( ddF, bF, bG );                 Cudd_Ref( bRes1 );
Abc_PrintTime( 1, "Runtime of Cudd_bddAnd  ", Abc_Clock() - clk );

    // compute the result
Counter = 0;
clk = Abc_Clock();
    bRes2 = Extra_bddAndPermute( ddF, bF, ddG, bG2, NULL );      Cudd_Ref( bRes2 );
Abc_PrintTime( 1, "Runtime of new procedure", Abc_Clock() - clk );
printf( "Recursive calls = %d\n", Counter );
printf( "|F| =%6d  |G| =%6d  |H| =%6d  |F|*|G| =%9d  ", 
       Cudd_DagSize(bF), Cudd_DagSize(bG), Cudd_DagSize(bRes2), 
       Cudd_DagSize(bF) * Cudd_DagSize(bG) );

    if ( bRes1 == bRes2 )
        printf( "Result verified.\n\n" );
    else
        printf( "Result is incorrect.\n\n" );

    Cudd_RecursiveDeref( ddF, bRes1 );
    Cudd_RecursiveDeref( ddF, bRes2 );
    // quit the new manager
    Cudd_RecursiveDeref( ddG, bG2 );
    Extra_StopManager( ddG );

    // re-enable variable ordering in ddF
    Cudd_AutodynEnable( ddF, CUDD_REORDER_SYMM_SIFT );
}